

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultGif.h
# Opt level: O0

void __thiscall TgBot::InlineQueryResultGif::InlineQueryResultGif(InlineQueryResultGif *this)

{
  InlineQueryResultGif *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultGif_0051b4a8;
  std::__cxx11::string::string((string *)&this->gifUrl);
  std::__cxx11::string::string((string *)&this->thumbUrl);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  this->gifWidth = 0;
  this->gifHeight = 0;
  return;
}

Assistant:

InlineQueryResultGif() {
        this->type = TYPE;
        this->gifWidth = 0;
        this->gifHeight = 0;
    }